

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,REF_GRID ref_grid)

{
  double *pdVar1;
  size_t __size;
  int iVar2;
  REF_NODE pRVar3;
  REF_MPI ref_mpi;
  uint uVar4;
  uint uVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  REF_DBL max_threshold;
  REF_DBL temp;
  REF_DBL diag [12];
  uint local_e4;
  double local_d8;
  REF_DBL *local_d0;
  void *local_c8;
  REF_DBL *local_c0;
  REF_DBL *local_b8;
  double local_b0;
  REF_MPI local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  
  pRVar3 = ref_grid->node;
  iVar2 = pRVar3->max;
  if ((long)iVar2 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x394,
           "ref_metric_hessian_filter","malloc min_h of REF_DBL negative");
    local_e4 = 1;
  }
  else {
    local_a8 = ref_grid->mpi;
    __size = (long)iVar2 * 8;
    pRVar6 = (REF_DBL *)malloc(__size);
    if (pRVar6 == (REF_DBL *)0x0) {
      pcVar8 = "malloc min_h of REF_DBL NULL";
      uVar7 = 0x394;
    }
    else {
      local_b8 = (REF_DBL *)malloc((ulong)(uint)(iVar2 * 6) << 3);
      if (local_b8 == (REF_DBL *)0x0) {
        pcVar8 = "malloc hess_min_h of REF_DBL NULL";
        uVar7 = 0x395;
      }
      else {
        local_c8 = malloc(__size);
        if (local_c8 != (void *)0x0) {
          local_d0 = pRVar6;
          local_c0 = metric;
          if (0 < pRVar3->max) {
            lVar9 = 0;
            do {
              if (-1 < pRVar3->global[lVar9]) {
                uVar4 = ref_matrix_diag_m(metric,&local_98);
                if (uVar4 == 0) {
                  if (ref_grid->twod == 0) {
                    uVar4 = ref_matrix_descending_eig(&local_98);
                    if (uVar4 != 0) {
                      uVar7 = 0x39e;
                      pcVar8 = "3D ascend";
                      goto LAB_001c2da3;
                    }
                  }
                  else {
                    uVar4 = ref_matrix_descending_eig_twod(&local_98);
                    if (uVar4 != 0) {
                      uVar7 = 0x39c;
                      pcVar8 = "2D ascend";
LAB_001c2da3:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,uVar7,"ref_metric_hessian_filter",(ulong)uVar4,pcVar8);
                      local_e4 = uVar4;
                    }
                  }
                  pRVar6 = local_d0;
                  if (uVar4 != 0) goto LAB_001c2db2;
                  dVar13 = 0.0;
                  if (0.0 <= local_98) {
                    dVar13 = local_98;
                  }
                  if (dVar13 < 0.0) {
                    dVar13 = sqrt(dVar13);
                  }
                  else {
                    dVar13 = SQRT(dVar13);
                  }
                  dVar12 = dVar13 * 1e+20;
                  if (dVar12 <= -dVar12) {
                    dVar12 = -dVar12;
                  }
                  pRVar6[lVar9] =
                       (REF_DBL)(~-(ulong)(1.0 < dVar12) & 0x6974e718d7d7625a |
                                (ulong)(1.0 / dVar13) & -(ulong)(1.0 < dVar12));
                  bVar11 = true;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x39a,"ref_metric_hessian_filter",(ulong)uVar4,"decomp");
                  local_e4 = uVar4;
LAB_001c2db2:
                  bVar11 = false;
                }
                if (!bVar11) {
                  return local_e4;
                }
              }
              lVar9 = lVar9 + 1;
              metric = metric + 6;
            } while (lVar9 < pRVar3->max);
          }
          pRVar6 = local_b8;
          uVar4 = ref_recon_hessian(ref_grid,local_d0,local_b8,REF_RECON_L2PROJECTION);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x3a9,"ref_metric_hessian_filter",(ulong)uVar4,"hess");
            return uVar4;
          }
          local_d8 = 0.0;
          if (0 < pRVar3->max) {
            lVar9 = 0;
            do {
              if (-1 < pRVar3->global[lVar9]) {
                uVar4 = ref_matrix_diag_m(pRVar6,&local_98);
                if (uVar4 == 0) {
                  if (ref_grid->twod == 0) {
                    uVar4 = ref_matrix_descending_eig(&local_98);
                    uVar10 = (ulong)uVar4;
                    if (uVar4 != 0) {
                      uVar7 = 0x3b2;
                      pcVar8 = "3D ascend";
                      goto LAB_001c3041;
                    }
                  }
                  else {
                    uVar4 = ref_matrix_descending_eig_twod(&local_98);
                    uVar10 = (ulong)uVar4;
                    if (uVar4 != 0) {
                      uVar7 = 0x3b0;
                      pcVar8 = "2D ascend";
LAB_001c3041:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,uVar7,"ref_metric_hessian_filter",uVar10,pcVar8);
                      local_e4 = (uint)uVar10;
                    }
                  }
                  if ((int)uVar10 != 0) goto LAB_001c3052;
                  dVar13 = local_98;
                  if (local_98 <= -local_98) {
                    dVar13 = -local_98;
                  }
                  dVar13 = log10(dVar13);
                  *(double *)((long)local_c8 + lVar9 * 8) = dVar13;
                  if (local_d8 <= dVar13) {
                    local_d8 = dVar13;
                  }
                  bVar11 = true;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x3ae,"ref_metric_hessian_filter",(ulong)uVar4,"decomp");
                  local_e4 = uVar4;
LAB_001c3052:
                  bVar11 = false;
                }
                if (!bVar11) {
                  return local_e4;
                }
              }
              lVar9 = lVar9 + 1;
              pRVar6 = pRVar6 + 6;
            } while (lVar9 < pRVar3->max);
          }
          ref_mpi = local_a8;
          local_a0 = local_d8;
          uVar4 = ref_mpi_max(local_a8,&local_a0,&local_d8,3);
          pRVar6 = local_b8;
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x3b8,"ref_metric_hessian_filter",(ulong)uVar4,"max");
            return uVar4;
          }
          local_d8 = local_d8 * 0.5;
          if ((long)pRVar3->max < 1) {
            local_b0 = 0.0;
          }
          else {
            local_b0 = 0.0;
            lVar9 = 0;
            do {
              if ((-1 < pRVar3->global[lVar9]) &&
                 (pdVar1 = (double *)((long)local_c8 + lVar9 * 8),
                 *pdVar1 <= local_d8 && local_d8 != *pdVar1)) {
                dVar12 = local_d0[lVar9] * local_d0[lVar9];
                dVar13 = dVar12 * 1e+20;
                if (dVar13 <= -dVar13) {
                  dVar13 = -dVar13;
                }
                if ((1.0 < dVar13) && (dVar12 = 1.0 / dVar12, local_b0 <= dVar12)) {
                  local_b0 = dVar12;
                }
              }
              lVar9 = lVar9 + 1;
            } while (pRVar3->max != lVar9);
          }
          local_a0 = local_b0;
          uVar4 = ref_mpi_max(ref_mpi,&local_a0,&local_b0,3);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x3c7,"ref_metric_hessian_filter",(ulong)uVar4,"max");
            return uVar4;
          }
          if (0 < pRVar3->max) {
            lVar9 = 0;
            do {
              if (-1 < pRVar3->global[lVar9]) {
                uVar4 = ref_matrix_diag_m(local_c0,&local_98);
                if (uVar4 == 0) {
                  uVar4 = local_e4;
                  if (ref_grid->twod == 0) {
                    uVar5 = ref_matrix_descending_eig(&local_98);
                    if (uVar5 != 0) {
                      uVar7 = 0x3d1;
                      pcVar8 = "3D ascend";
                      goto LAB_001c32fb;
                    }
                  }
                  else {
                    uVar5 = ref_matrix_descending_eig_twod(&local_98);
                    if (uVar5 != 0) {
                      uVar7 = 0x3cf;
                      pcVar8 = "2D ascend";
LAB_001c32fb:
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,uVar7,"ref_metric_hessian_filter",(ulong)uVar5,pcVar8);
                      uVar4 = uVar5;
                    }
                  }
                  if (uVar5 != 0) goto LAB_001c330a;
                  if (local_b0 <= local_98) {
                    local_98 = local_b0;
                  }
                  if (local_b0 <= local_90) {
                    local_90 = local_b0;
                  }
                  if ((ref_grid->twod == 0) && (local_b0 <= local_88)) {
                    local_88 = local_b0;
                  }
                  uVar5 = ref_matrix_form_m(&local_98,local_c0);
                  bVar11 = uVar5 == 0;
                  local_e4 = uVar4;
                  if (!bVar11) {
                    bVar11 = false;
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x3d7,"ref_metric_hessian_filter",(ulong)uVar5,"reform");
                    local_e4 = uVar5;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x3cd,"ref_metric_hessian_filter",(ulong)uVar4,"decomp");
LAB_001c330a:
                  bVar11 = false;
                  local_e4 = uVar4;
                }
                if (!bVar11) {
                  return local_e4;
                }
              }
              lVar9 = lVar9 + 1;
              local_c0 = local_c0 + 6;
              pRVar6 = local_b8;
            } while (lVar9 < pRVar3->max);
          }
          free(local_c8);
          free(pRVar6);
          free(local_d0);
          return 0;
        }
        pcVar8 = "malloc threshold of REF_DBL NULL";
        uVar7 = 0x396;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_hessian_filter",pcVar8);
    local_e4 = 2;
  }
  return local_e4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL *min_h, *hess_min_h, *threshold;
  REF_DBL temp, max_threshold, max_valid, eig;
  REF_INT node;
  ref_malloc(min_h, ref_node_max(ref_node), REF_DBL);
  ref_malloc(hess_min_h, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(threshold, ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    min_h[node] = sqrt(MAX(0.0, ref_matrix_eig(diag, 0)));
    if (ref_math_divisible(1.0, min_h[node])) {
      min_h[node] = 1.0 / min_h[node];
    } else {
      min_h[node] = REF_DBL_MAX;
    }
  }

  RSS(ref_recon_hessian(ref_grid, min_h, hess_min_h, REF_RECON_L2PROJECTION),
      "hess");

  max_threshold = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(hess_min_h[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    threshold[node] = log10(ABS(ref_matrix_eig(diag, 0)));
    max_threshold = MAX(max_threshold, threshold[node]);
  }
  temp = max_threshold;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_threshold, REF_DBL_TYPE), "max");

  /* find the largest valid eigenvalue that is not in a discontinuity */
  max_threshold = 0.5 * max_threshold;
  max_valid = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    if (threshold[node] < max_threshold) {
      REF_DBL h2 = min_h[node] * min_h[node];
      if (ref_math_divisible(1.0, h2)) {
        eig = 1.0 / h2;
        max_valid = MAX(max_valid, eig);
      }
    }
  }
  temp = max_valid;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_valid, REF_DBL_TYPE), "max");

  /* limit hessian eigenvalues everwhere based on what is considered valid
   * outside a discontinuity */
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    ref_matrix_eig(diag, 0) = MIN(ref_matrix_eig(diag, 0), max_valid);
    ref_matrix_eig(diag, 1) = MIN(ref_matrix_eig(diag, 1), max_valid);
    if (!ref_grid_twod(ref_grid))
      ref_matrix_eig(diag, 2) = MIN(ref_matrix_eig(diag, 2), max_valid);
    RSS(ref_matrix_form_m(diag, &(metric[6 * node])), "reform");
  }
  ref_free(threshold);
  ref_free(hess_min_h);
  ref_free(min_h);

  return REF_SUCCESS;
}